

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

String * __thiscall List<String>::operator[](List<String> *this,int n)

{
  size_type sVar1;
  reference pSVar2;
  int local_20;
  int local_1c;
  
  local_20 = n;
  sVar1 = std::deque<String,_std::allocator<String>_>::size(&this->_deque);
  if ((int)sVar1 <= n) {
    sVar1 = std::deque<String,_std::allocator<String>_>::size(&this->_deque);
    local_1c = (int)sVar1;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:264: n (%1) is not less than size() (%2)"
                   ,&local_20,&local_1c);
    n = local_20;
  }
  pSVar2 = std::_Deque_iterator<String,_String_&,_String_*>::operator[]
                     (&(this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
                       super__Deque_impl_data._M_start,(long)n);
  return pSVar2;
}

Assistant:

inline const T& List<T>::operator[] (int n) const
{
	ASSERT_LT (n, size());
	return _deque[n];
}